

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_clampVecScalarScalar_vec3(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int i;
  long lVar4;
  uint uVar5;
  float fVar6;
  Vector<float,_3> res;
  float local_24 [3];
  int local_18 [6];
  
  local_24[0] = c->in[0].m_data[2];
  local_24[1] = c->in[0].m_data[0];
  local_24[2] = c->in[0].m_data[1];
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[2].m_data[1];
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar4 = 0;
  do {
    fVar3 = local_24[lVar4];
    fVar6 = fVar2;
    if (fVar3 <= fVar2) {
      fVar6 = fVar3;
    }
    uVar5 = -(uint)(fVar3 < fVar1);
    res.m_data[lVar4] = (float)(uVar5 & (uint)fVar1 | ~uVar5 & (uint)fVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar4 = 2;
  do {
    (c->color).m_data[local_18[lVar4]] = res.m_data[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }